

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function.hpp
# Opt level: O0

void duckdb::AggregateFunction::
     StateInitialize<duckdb::KurtosisState,duckdb::KurtosisOperation<duckdb::KurtosisFlagNoBiasCorrection>,(duckdb::AggregateDestructorType)0>
               (AggregateFunction *param_1,data_ptr_t state)

{
  KurtosisState *in_RSI;
  
  KurtosisOperation<duckdb::KurtosisFlagNoBiasCorrection>::Initialize<duckdb::KurtosisState>(in_RSI)
  ;
  return;
}

Assistant:

static void StateInitialize(const AggregateFunction &, data_ptr_t state) {
		// FIXME: we should remove the "destructor_type" option in the future
#if !defined(__GNUC__) || (__GNUC__ >= 5)
		static_assert(std::is_trivially_move_constructible<STATE>::value ||
		                  destructor_type == AggregateDestructorType::LEGACY,
		              "Aggregate state must be trivially move constructible");
#endif
		OP::Initialize(*reinterpret_cast<STATE *>(state));
	}